

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O3

HighsStatus __thiscall Highs::stopCallback(Highs *this,HighsCallbackType callback_type)

{
  ulong *puVar1;
  byte bVar2;
  HighsStatus HVar3;
  
  HVar3 = kError;
  if (callback_type < kNumCallbackType) {
    if ((this->callback_).user_callback.super__Function_base._M_manager == (_Manager_type)0x0) {
      highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kWarning,
                   "Cannot stop callback when user_callback not defined\n");
      return kWarning;
    }
    bVar2 = (byte)callback_type & 0x3f;
    puVar1 = (this->callback_).active.super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    *puVar1 = *puVar1 & (-2L << bVar2 | 0xfffffffffffffffeU >> 0x40 - bVar2);
    HVar3 = kOk;
    if (callback_type == kCallbackLogging) {
      (this->options_).super_HighsOptionsStruct.log_options.user_callback_active = false;
      return kOk;
    }
  }
  return HVar3;
}

Assistant:

HighsStatus Highs::stopCallback(const HighsCallbackType callback_type) {
  const bool callback_type_ok =
      callback_type >= kCallbackMin && callback_type <= kCallbackMax;
  assert(callback_type_ok);
  if (!callback_type_ok) return HighsStatus::kError;
  if (!this->callback_.user_callback) {
    highsLogUser(options_.log_options, HighsLogType::kWarning,
                 "Cannot stop callback when user_callback not defined\n");
    return HighsStatus::kWarning;
  }
  assert(int(this->callback_.active.size()) == kNumCallbackType);
  this->callback_.active[callback_type] = false;
  // Possibly modify the logging callback activity
  if (callback_type == kCallbackLogging)
    options_.log_options.user_callback_active = false;
  return HighsStatus::kOk;
}